

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall RenderTarget::add(RenderTarget *this,Renderable *object)

{
  pointer ppRVar1;
  int iVar2;
  ulong uVar3;
  const_iterator __position;
  ulong uVar4;
  uint i;
  Renderable *local_10;
  Renderable *object_local;
  
  iVar2 = depth;
  object->depth = depth;
  ppRVar1 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if ((ulong)((long)__position._M_current - (long)ppRVar1 >> 3) <= uVar4) {
      uVar3 = (ulong)((long)__position._M_current - (long)ppRVar1) >> 3 & 0xffffffff;
      goto LAB_0018c183;
    }
    uVar3 = (ulong)((int)uVar4 + 1);
  } while (iVar2 <= ppRVar1[uVar4]->depth);
  __position._M_current = ppRVar1 + uVar4;
  goto LAB_0018c1a6;
  while (uVar4 = (ulong)((uint)uVar3 & 0x7fffffff), ppRVar1[uVar4]->depth != iVar2) {
LAB_0018c183:
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) goto LAB_0018c1a6;
  }
  __position._M_current = ppRVar1 + uVar4 + 1;
LAB_0018c1a6:
  local_10 = object;
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
            (&this->objects,__position,&local_10);
  return;
}

Assistant:

void add(Renderable *object){
		object->depth = depth;
		for(unsigned i = 0; i < objects.size(); ++i){
			if(objects[i]->depth < depth){
				objects.insert(objects.begin()+i, object);
				return;
			}
		}
		for(int i = objects.size()-1; i >= 0; i--){
			if(objects[i]->depth == depth){
				objects.insert(objects.begin()+i+1, object);
				return;
			}
		}
		objects.insert(objects.end(), object);

	}